

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void __thiscall mjs::print_visitor::operator()(print_visitor *this,do_statement *s)

{
  statement *s_00;
  expression *e;
  do_statement *s_local;
  print_visitor *this_local;
  
  std::operator<<(this->os_,"do ");
  s_00 = do_statement::s(s);
  accept<mjs::print_visitor>(s_00,this);
  std::operator<<(this->os_," while (");
  e = do_statement::cond(s);
  accept<mjs::print_visitor>(e,this);
  std::operator<<(this->os_,") ");
  return;
}

Assistant:

void operator()(const do_statement& s) {
        os_ << "do ";
        accept(s.s(), *this);
        os_ << " while (";
        accept(s.cond(), *this);
        os_ << ") ";
    }